

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O3

void test_inflate(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  uint extraout_EAX_03;
  uint extraout_EAX_04;
  int iVar3;
  int extraout_EAX_05;
  size_t sVar4;
  undefined8 uVar5;
  Byte *compr_00;
  Byte *uncompr_00;
  uLong uVar6;
  long lVar7;
  char **ppcVar8;
  ulong *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 *extraout_RDX_01;
  char *__s1;
  undefined8 unaff_RBP;
  undefined4 uVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  ulong *puVar14;
  ulong uVar15;
  ulong uVar16;
  Byte **unaff_R12;
  ulong **ppuVar17;
  uLong auStack_420 [2];
  undefined1 *puStack_410;
  char *pcStack_408;
  code *pcStack_400;
  ulong uStack_3f8;
  undefined4 uStack_3f0;
  undefined4 uStack_3d8;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  uLong uStack_398;
  char *pcStack_388;
  undefined1 *puStack_380;
  code *pcStack_378;
  char *pcStack_370;
  int iStack_368;
  undefined1 *puStack_358;
  undefined4 uStack_350;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_320;
  uLong uStack_310;
  ulong uStack_2f8;
  code *pcStack_2f0;
  ulong uStack_2e8;
  uint uStack_2e0;
  undefined4 uStack_2c8;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  char *pcStack_278;
  ulong uStack_270;
  code *pcStack_268;
  char *pcStack_258;
  uint uStack_250;
  ulong uStack_240;
  undefined4 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  long lStack_1e8;
  ulong *puStack_1e0;
  ulong uStack_1d8;
  code *pcStack_1d0;
  ulong uStack_1c0;
  undefined4 uStack_1b8;
  undefined4 uStack_1a0;
  ulong uStack_198;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  uLong uStack_150;
  ulong *puStack_148;
  code *pcStack_138;
  ulong *puStack_130;
  uint uStack_128;
  ulong *puStack_118;
  uint uStack_110;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  Byte *pBStack_c0;
  undefined1 *puStack_b8;
  Byte *local_98;
  undefined4 local_90;
  ulong local_88;
  Byte *local_80;
  undefined4 local_78;
  ulong local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  
  builtin_memcpy(uncompr,"garbage",8);
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  local_90 = 0;
  pcVar10 = "1.2.11";
  uVar6 = uncomprLen;
  local_98 = compr;
  local_80 = uncompr;
  iVar1 = inflateInit_(&local_98,"1.2.11",0x70);
  if (iVar1 == 0) {
    unaff_RBP = 1;
    do {
      if ((uncomprLen <= local_70) || (comprLen <= local_88)) goto LAB_0010302e;
      local_78 = 1;
      local_90 = 1;
      pcVar10 = (char *)0x0;
      iVar1 = inflate(&local_98);
    } while (iVar1 == 0);
    if (iVar1 != 1) {
      test_inflate_cold_4();
      unaff_R12 = &local_98;
      goto LAB_00103072;
    }
LAB_0010302e:
    uVar2 = inflateEnd(&local_98);
    unaff_R12 = &local_98;
    if (uVar2 != 0) goto LAB_00103079;
    pcVar10 = hello;
    puVar14 = (ulong *)uncompr;
    iVar1 = strcmp((char *)uncompr,hello);
    unaff_R12 = &local_98;
    if (iVar1 == 0) {
      printf("inflate(): %s\n",uncompr);
      return;
    }
  }
  else {
LAB_00103072:
    test_inflate_cold_1();
    uVar2 = extraout_EAX;
LAB_00103079:
    puVar14 = (ulong *)(ulong)uVar2;
    test_inflate_cold_2();
  }
  test_inflate_cold_3();
  ppuVar17 = &puStack_130;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uVar11 = 1;
  lVar7 = 0x70;
  pcStack_138 = (code *)0x1030c6;
  pBStack_c0 = uncompr;
  puStack_b8 = (undefined1 *)unaff_R12;
  iVar1 = deflateInit_(&puStack_130,1,"1.2.11");
  if (iVar1 == 0) {
    uVar11 = 0;
    pcStack_138 = (code *)0x1030e6;
    puStack_130 = extraout_RDX;
    uStack_128 = (uint)uVar6;
    puStack_118 = puVar14;
    uStack_110 = (uint)pcVar10;
    iVar1 = deflate();
    if (iVar1 != 0) goto LAB_0010317e;
    if (uStack_128 != 0) goto LAB_00103185;
    pcStack_138 = (code *)0x103108;
    deflateParams(&puStack_130,0,0);
    uStack_128 = (uint)pcVar10 >> 1;
    pcVar10 = (char *)(ulong)uStack_128;
    uVar11 = 0;
    pcStack_138 = (code *)0x10311d;
    puStack_130 = puVar14;
    iVar1 = deflate(&puStack_130);
    if (iVar1 != 0) goto LAB_0010318a;
    pcStack_138 = (code *)0x103136;
    deflateParams(&puStack_130,9,1);
    uVar11 = 0;
    pcStack_138 = (code *)0x103147;
    puStack_130 = extraout_RDX;
    uStack_128 = (uint)uVar6;
    iVar1 = deflate(&puStack_130);
    if (iVar1 != 0) goto LAB_00103191;
    uVar11 = 4;
    pcStack_138 = (code *)0x103158;
    iVar1 = deflate(&puStack_130);
    ppuVar17 = &puStack_130;
    if (iVar1 != 1) goto LAB_00103198;
    pcStack_138 = (code *)0x103165;
    uVar2 = deflateEnd(&puStack_130);
    ppuVar17 = &puStack_130;
    if (uVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_138 = (code *)0x10317e;
    test_large_deflate_cold_1();
LAB_0010317e:
    pcStack_138 = (code *)0x103185;
    test_large_deflate_cold_2();
LAB_00103185:
    pcStack_138 = (code *)0x10318a;
    test_large_deflate_cold_3();
LAB_0010318a:
    ppuVar17 = (ulong **)pcVar10;
    pcStack_138 = (code *)0x103191;
    test_large_deflate_cold_4();
LAB_00103191:
    pcStack_138 = (code *)0x103198;
    test_large_deflate_cold_5();
LAB_00103198:
    pcStack_138 = (code *)0x10319d;
    test_large_deflate_cold_6();
    uVar2 = extraout_EAX_00;
  }
  uVar15 = (ulong)uVar2;
  pcStack_138 = test_large_inflate;
  test_large_deflate_cold_7();
  *extraout_RDX_00 = 0x65676162726167;
  uStack_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_1b8 = (undefined4)uVar11;
  pcVar10 = "1.2.11";
  pcStack_1d0 = (code *)0x1031f4;
  uStack_1c0 = uVar15;
  uStack_150 = uVar6;
  puStack_148 = puVar14;
  pcStack_138 = (code *)ppuVar17;
  iVar1 = inflateInit_(&uStack_1c0,"1.2.11",0x70);
  if (iVar1 == 0) {
    puVar14 = &uStack_1c0;
    do {
      uStack_1a0 = (undefined4)lVar7;
      pcVar10 = (char *)0x0;
      pcStack_1d0 = (code *)0x103210;
      iVar1 = inflate(puVar14);
    } while (iVar1 == 0);
    if (iVar1 != 1) {
      pcStack_1d0 = (code *)0x103257;
      test_large_inflate_cold_4();
      goto LAB_00103257;
    }
    pcStack_1d0 = (code *)0x103223;
    uVar2 = inflateEnd(&uStack_1c0);
    if (uVar2 != 0) goto LAB_0010325e;
    uVar11 = uVar11 >> 1;
    uVar15 = uStack_198;
    if (uStack_198 == uVar11 + lVar7 * 2) {
      pcStack_1d0 = (code *)0x103244;
      puts("large_inflate(): OK");
      return;
    }
  }
  else {
LAB_00103257:
    pcStack_1d0 = (code *)0x10325e;
    test_large_inflate_cold_1();
    uVar2 = extraout_EAX_01;
LAB_0010325e:
    uVar15 = (ulong)uVar2;
    pcStack_1d0 = (code *)0x103265;
    test_large_inflate_cold_2();
  }
  pcStack_1d0 = test_flush;
  test_large_inflate_cold_3();
  pcStack_268 = (code *)0x10328a;
  lStack_1e8 = lVar7;
  puStack_1e0 = puVar14;
  uStack_1d8 = uVar11;
  sVar4 = strlen(hello);
  uStack_218 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  uVar11 = 0xffffffff;
  ppcVar8 = (char **)0x70;
  pcStack_268 = (code *)0x1032b7;
  iVar1 = deflateInit_(&pcStack_258,0xffffffff,"1.2.11");
  if (iVar1 == 0) {
    pcStack_258 = hello;
    uStack_250 = 3;
    uStack_238 = *(undefined4 *)pcVar10;
    uVar11 = 3;
    pcStack_268 = (code *)0x1032dd;
    uStack_240 = uVar15;
    iVar1 = deflate();
    if (iVar1 != 0) goto LAB_0010332a;
    *(char *)(uVar15 + 3) = *(char *)(uVar15 + 3) + '\x01';
    uStack_250 = (int)sVar4 - 2;
    sVar4 = (size_t)uStack_250;
    uVar11 = 4;
    pcStack_268 = (code *)0x1032fc;
    uVar2 = deflate();
    if (1 < uVar2) goto LAB_00103331;
    pcStack_268 = (code *)0x10330b;
    uVar2 = deflateEnd(&pcStack_258);
    if (uVar2 == 0) {
      *(undefined8 *)pcVar10 = uStack_230;
      return;
    }
  }
  else {
    pcStack_268 = (code *)0x10332a;
    test_flush_cold_1();
LAB_0010332a:
    pcStack_268 = (code *)0x103331;
    test_flush_cold_2();
LAB_00103331:
    pcStack_268 = (code *)0x103338;
    test_flush_cold_4();
    uVar2 = extraout_EAX_02;
  }
  uVar16 = (ulong)uVar2;
  pcStack_268 = test_sync;
  test_flush_cold_3();
  *extraout_RDX_01 = 0x65676162726167;
  uStack_2a8 = 0;
  uStack_2a0 = 0;
  uStack_298 = 0;
  uStack_2e0 = 2;
  pcVar12 = "1.2.11";
  pcStack_2f0 = (code *)0x10338e;
  uStack_2e8 = uVar16;
  pcStack_278 = pcVar10;
  uStack_270 = uVar15;
  pcStack_268 = (code *)sVar4;
  iVar1 = inflateInit_(&uStack_2e8,"1.2.11",0x70);
  if (iVar1 == 0) {
    uStack_2c8 = SUB84(ppcVar8,0);
    pcVar12 = (char *)0x0;
    pcStack_2f0 = (code *)0x1033a4;
    iVar1 = inflate();
    if (iVar1 != 0) goto LAB_001033fc;
    uStack_2e0 = (int)uVar11 - 2;
    uVar11 = (ulong)uStack_2e0;
    pcStack_2f0 = (code *)0x1033b8;
    iVar1 = inflateSync();
    if (iVar1 != 0) goto LAB_00103403;
    pcVar12 = (char *)0x4;
    pcStack_2f0 = (code *)0x1033c9;
    iVar1 = inflate(&uStack_2e8);
    if (iVar1 != -3) goto LAB_0010340a;
    pcStack_2f0 = (code *)0x1033d6;
    uVar2 = inflateEnd(&uStack_2e8);
    if (uVar2 == 0) {
      pcStack_2f0 = (code *)0x1033eb;
      printf("after inflateSync(): hel%s\n",extraout_RDX_01);
      return;
    }
  }
  else {
    pcStack_2f0 = (code *)0x1033fc;
    test_sync_cold_1();
LAB_001033fc:
    pcStack_2f0 = (code *)0x103403;
    test_sync_cold_2();
LAB_00103403:
    pcStack_2f0 = (code *)0x10340a;
    test_sync_cold_3();
LAB_0010340a:
    pcStack_2f0 = (code *)0x10340f;
    test_sync_cold_4();
    uVar2 = extraout_EAX_03;
  }
  puVar14 = (ulong *)(ulong)uVar2;
  pcStack_2f0 = test_dict_deflate;
  test_sync_cold_5();
  uStack_330 = 0;
  uStack_328 = 0;
  uStack_320 = 0;
  uVar9 = 9;
  pcVar10 = (char *)0x70;
  pcStack_378 = (code *)0x10344d;
  uStack_2f8 = uVar11;
  pcStack_2f0 = (code *)ppcVar8;
  iVar1 = deflateInit_(&pcStack_370,9,"1.2.11");
  if (iVar1 == 0) {
    uVar9 = 0x104348;
    pcStack_378 = (code *)0x103465;
    iVar1 = deflateSetDictionary(&pcStack_370,"hello",6);
    if (iVar1 != 0) goto LAB_001034c3;
    dictId = uStack_310;
    uStack_350 = SUB84(pcVar12,0);
    pcStack_370 = hello;
    pcStack_378 = (code *)0x10348e;
    puStack_358 = (undefined1 *)puVar14;
    sVar4 = strlen(hello);
    iStack_368 = (int)sVar4 + 1;
    uVar9 = 4;
    pcStack_378 = (code *)0x1034a1;
    iVar1 = deflate(&pcStack_370);
    ppcVar8 = &pcStack_370;
    if (iVar1 != 1) goto LAB_001034ca;
    pcStack_378 = (code *)0x1034ae;
    uVar2 = deflateEnd(&pcStack_370);
    ppcVar8 = &pcStack_370;
    if (uVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_378 = (code *)0x1034c3;
    test_dict_deflate_cold_1();
LAB_001034c3:
    pcStack_378 = (code *)0x1034ca;
    test_dict_deflate_cold_2();
LAB_001034ca:
    pcStack_378 = (code *)0x1034cf;
    test_dict_deflate_cold_3();
    uVar2 = extraout_EAX_04;
  }
  uVar11 = (ulong)uVar2;
  pcStack_378 = test_dict_inflate;
  test_dict_deflate_cold_4();
  builtin_strncpy(__s1,"garbage",8);
  uStack_3b8 = 0;
  uStack_3b0 = 0;
  uStack_3a8 = 0;
  pcVar13 = "1.2.11";
  pcStack_400 = (code *)0x10351e;
  uStack_3f8 = uVar11;
  uStack_3f0 = uVar9;
  pcStack_388 = pcVar12;
  puStack_380 = (undefined1 *)puVar14;
  pcStack_378 = (code *)ppcVar8;
  iVar1 = inflateInit_(&uStack_3f8,"1.2.11",0x70);
  if (iVar1 == 0) {
    uStack_3d8 = SUB84(pcVar10,0);
    pcVar10 = "hello";
    do {
      pcVar13 = (char *)0x0;
      pcStack_400 = (code *)0x103542;
      iVar1 = inflate(&uStack_3f8);
      if (iVar1 == 2) {
        if (uStack_398 != dictId) {
          pcStack_400 = (code *)0x1035b6;
          test_dict_inflate_cold_2();
          puVar14 = &uStack_3f8;
          goto LAB_001035b6;
        }
        pcVar13 = "hello";
        pcStack_400 = (code *)0x10356c;
        iVar1 = inflateSetDictionary(&uStack_3f8,"hello",6);
      }
      else if (iVar1 == 1) goto LAB_00103577;
    } while (iVar1 == 0);
    pcStack_400 = (code *)0x103577;
    test_dict_inflate_cold_5();
LAB_00103577:
    pcStack_400 = (code *)0x10357f;
    iVar1 = inflateEnd(&uStack_3f8);
    puVar14 = &uStack_3f8;
    if (iVar1 == 0) {
      pcVar13 = hello;
      pcStack_400 = (code *)0x103592;
      pcVar12 = __s1;
      iVar3 = strcmp(__s1,hello);
      iVar1 = (int)pcVar12;
      puVar14 = &uStack_3f8;
      if (iVar3 == 0) {
        pcStack_400 = (code *)0x1035a7;
        printf("inflate with dictionary: %s\n",__s1);
        return;
      }
      goto LAB_001035c4;
    }
  }
  else {
LAB_001035b6:
    pcStack_400 = (code *)0x1035bd;
    test_dict_inflate_cold_1();
    iVar1 = extraout_EAX_05;
  }
  pcStack_400 = (code *)0x1035c4;
  test_dict_inflate_cold_3();
LAB_001035c4:
  pcStack_400 = main;
  test_dict_inflate_cold_4();
  auStack_420[0] = 40000;
  puStack_410 = (undefined1 *)puVar14;
  pcStack_408 = pcVar10;
  pcStack_400 = (code *)unaff_RBP;
  pcVar10 = (char *)zlibVersion();
  if (*pcVar10 == '1') {
    pcVar10 = (char *)zlibVersion();
    iVar3 = strcmp(pcVar10,"1.2.11");
    if (iVar3 != 0) {
      main_cold_2();
    }
    uVar5 = zlibCompileFlags();
    printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n","1.2.11",0x12b0,uVar5);
    compr_00 = (Byte *)calloc(40000,1);
    uncompr_00 = (Byte *)calloc(40000,1);
    if ((compr_00 != (Byte *)0x0) && (uncompr_00 != (Byte *)0x0)) {
      test_compress(compr_00,40000,uncompr_00,40000);
      if (iVar1 < 2) {
        pcVar10 = "foo.gz";
      }
      else {
        pcVar10 = *(char **)(pcVar13 + 8);
      }
      test_gzio(pcVar10,uncompr_00,40000);
      test_deflate(compr_00,40000);
      test_inflate(compr_00,40000,uncompr_00,40000);
      test_large_deflate(compr_00,40000,uncompr_00,40000);
      test_large_inflate(compr_00,40000,uncompr_00,40000);
      test_flush(compr_00,auStack_420);
      test_sync(compr_00,auStack_420[0],uncompr_00,40000);
      test_dict_deflate(compr_00,40000);
      test_dict_inflate(compr_00,40000,uncompr_00,40000);
      free(compr_00);
      free(uncompr_00);
      return;
    }
  }
  else {
    main_cold_1();
  }
  puts("out of memory");
  exit(1);
}

Assistant:

void test_inflate(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    int err;
    z_stream d_stream; /* decompression stream */

    strcpy((char*)uncompr, "garbage");

    d_stream.zalloc = zalloc;
    d_stream.zfree = zfree;
    d_stream.opaque = (voidpf)0;

    d_stream.next_in  = compr;
    d_stream.avail_in = 0;
    d_stream.next_out = uncompr;

    err = inflateInit(&d_stream);
    CHECK_ERR(err, "inflateInit");

    while (d_stream.total_out < uncomprLen && d_stream.total_in < comprLen) {
        d_stream.avail_in = d_stream.avail_out = 1; /* force small buffers */
        err = inflate(&d_stream, Z_NO_FLUSH);
        if (err == Z_STREAM_END) break;
        CHECK_ERR(err, "inflate");
    }

    err = inflateEnd(&d_stream);
    CHECK_ERR(err, "inflateEnd");

    if (strcmp((char*)uncompr, hello)) {
        fprintf(stderr, "bad inflate\n");
        exit(1);
    } else {
        printf("inflate(): %s\n", (char *)uncompr);
    }
}